

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O0

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_3699c::phase_2_expand
          (limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_2,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *forbidden_values,size_t num_chall)

{
  bool bVar1;
  hash_context *phVar2;
  const_reference other;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *in_RDI;
  ulong in_R8;
  size_t k;
  bool good;
  GF2E candidate_R;
  size_t e;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *R_es;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  hash_context *in_stack_fffffffffffffe28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  allocator_type *in_stack_fffffffffffffe38;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *this_00;
  hash_context *local_190;
  GF2E local_180;
  ulong local_178;
  undefined1 local_16d;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158 [10];
  ulong local_58;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  
  this_00 = in_RDI;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  hash_init(in_stack_fffffffffffffe28,CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20))
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1177a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_48);
  hash_update(in_stack_fffffffffffffe28,
              (uint8_t *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),0x1177c4);
  hash_final((hash_context *)0x1177ce);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x1177f0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,(size_type)in_RDI,
             in_stack_fffffffffffffe38);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x117816);
  local_16d = 0;
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)0x117825);
  local_178 = 0;
  do {
    if (local_58 <= local_178) {
      local_16d = 1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe38)
      ;
      return this_00;
    }
    do {
      this = local_158;
      in_stack_fffffffffffffe38 =
           (allocator_type *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117857);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this);
      hash_squeeze(in_stack_fffffffffffffe28,
                   (uint8_t *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),0x11787b
                  );
      field::GF2E::GF2E(&local_180);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x117896);
      field::GF2E::from_bytes
                ((GF2E *)in_stack_fffffffffffffe28,
                 (uint8_t *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
      bVar1 = true;
      local_190 = (hash_context *)0x0;
      while (in_stack_fffffffffffffe28 = local_190,
            phVar2 = (hash_context *)
                     std::vector<field::GF2E,_std::allocator<field::GF2E>_>::size(local_50),
            in_stack_fffffffffffffe28 < phVar2) {
        other = std::vector<field::GF2E,_std::allocator<field::GF2E>_>::operator[]
                          (local_50,(size_type)local_190);
        in_stack_fffffffffffffe27 = field::GF2E::operator==(&local_180,other);
        if ((bool)in_stack_fffffffffffffe27) {
          bVar1 = false;
          break;
        }
        local_190 = (hash_context *)((local_190->sponge).state + 1);
      }
    } while (!bVar1);
    std::vector<field::GF2E,_std::allocator<field::GF2E>_>::push_back
              ((vector<field::GF2E,_std::allocator<field::GF2E>_> *)in_stack_fffffffffffffe38,
               (value_type *)this);
    local_178 = local_178 + 1;
  } while( true );
}

Assistant:

std::vector<field::GF2E> phase_2_expand(
    const limbo_instance_t &instance, const std::vector<uint8_t> &h_2,
    const std::vector<field::GF2E> &forbidden_values, const size_t num_chall) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_2.data(), h_2.size());
  hash_final(&ctx);

  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  std::vector<field::GF2E> R_es;
  for (size_t e = 0; e < num_chall; e++) { // instance.num_rounds; e++) {
    while (true) {
      hash_squeeze(&ctx, lambda_sized_buffer.data(),
                   lambda_sized_buffer.size());
      //  check that R is not in {0,...m2-1}
      field::GF2E candidate_R;
      candidate_R.from_bytes(lambda_sized_buffer.data());
      bool good = true;
      for (size_t k = 0; k < forbidden_values.size(); k++) {
        if (candidate_R == forbidden_values[k]) {
          good = false;
          break;
        }
      }
      if (good) {
        R_es.push_back(candidate_R);
        break;
      }
    }
  }
  return R_es;
}